

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

float __thiscall Assimp::B3DImporter::ReadFloat(B3DImporter *this)

{
  uint uVar1;
  float fVar2;
  size_type sVar3;
  float *pfVar4;
  allocator<char> local_39;
  string local_38;
  B3DImporter *pBStack_10;
  float n;
  B3DImporter *this_local;
  
  uVar1 = this->_pos;
  pBStack_10 = this;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_buf);
  if (uVar1 + 4 <= sVar3) {
    pfVar4 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&this->_buf,(ulong)this->_pos);
    fVar2 = *pfVar4;
    this->_pos = this->_pos + 4;
    return fVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EOF",&local_39);
  Fail(this,&local_38);
}

Assistant:

float B3DImporter::ReadFloat(){
    if( _pos+4<=_buf.size() ){
        float n;
        memcpy(&n, &_buf[_pos], 4);
        _pos+=4;
        return n;
    }
    Fail( "EOF" );
    return 0.0f;
}